

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall
ON_Annotation::SetTextHeight(ON_Annotation *this,ON_DimStyle *parent_style,double height)

{
  ON_DimStyle *pOVar1;
  double dVar2;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  dVar2 = ON_DimStyle::TextHeight(pOVar1);
  pOVar1 = Internal_GetOverrideStyle(this,height * 2.220446049250313e-16 < ABS(height - dVar2));
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetTextHeight(pOVar1,height);
    ON_DimStyle::SetFieldOverride
              (pOVar1,TextHeight,height * 2.220446049250313e-16 < ABS(height - dVar2));
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetTextHeight(const ON_DimStyle* parent_style, double height)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(height, parent_style->TextHeight());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetTextHeight(height);
    override_style->SetFieldOverride(ON_DimStyle::field::TextHeight, bCreate);
  }
}